

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O1

void refresh_mem_info(void)

{
  istream *piVar1;
  string s;
  stringstream ss;
  ifstream file;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0 [16];
  stringstream local_3a0 [128];
  ios_base local_320 [264];
  istream local_218 [520];
  
  std::ifstream::ifstream(local_218);
  std::__cxx11::stringstream::stringstream(local_3a0);
  local_3b8 = 0;
  local_3b0[0] = 0;
  local_3c0 = local_3b0;
  std::ifstream::open((char *)local_218,0x144038);
  piVar1 = std::operator>>(local_218,(string *)&local_3c0);
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  piVar1 = std::operator>>(piVar1,(string *)&local_3c0);
  piVar1 = std::operator>>(piVar1,(string *)&local_3c0);
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  piVar1 = std::operator>>(piVar1,(string *)&local_3c0);
  piVar1 = std::operator>>(piVar1,(string *)&local_3c0);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::ios_base::~ios_base(local_320);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

static void refresh_mem_info() {
    std::ifstream file;
    std::stringstream ss;
    std::string s;

    file.open("/proc/meminfo", std::fstream::in);
    file >> s >> mem_total >> s >> s >> mem_free >> s >> s >> mem_available;
}